

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

bool __thiscall FlatZinc::AST::Node::hasAtom(Node *this,string *id)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference ppNVar2;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Atom *a_1;
  Atom *at;
  size_type i;
  Array *a;
  long local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  size_type local_28;
  __type local_1;
  
  if (in_RDI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __dynamic_cast(in_RDI,&typeinfo,&Array::typeinfo,0);
  }
  if (__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (in_RDI == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = __dynamic_cast(in_RDI,&typeinfo,&Atom::typeinfo,0);
    }
    if (local_60 == 0) {
LAB_0013e60c:
      local_1 = false;
    }
    else {
      local_1 = std::operator==(in_RDI,__rhs);
    }
  }
  else {
    __rhs_00 = __rhs;
    local_28 = std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::size
                         ((vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *)
                          &__rhs->_M_string_length);
    do {
      __n = local_28 - 1;
      if (local_28 == 0) goto LAB_0013e60c;
      ppNVar2 = std::vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_>::
                operator[]((vector<FlatZinc::AST::Node_*,_std::allocator<FlatZinc::AST::Node_*>_> *)
                           &__rhs->_M_string_length,__n);
      if (*ppNVar2 == (value_type)0x0) {
        local_58 = 0;
      }
      else {
        local_58 = __dynamic_cast(*ppNVar2,&typeinfo,&Atom::typeinfo,0);
      }
      local_28 = __n;
    } while ((local_58 == 0) || (_Var1 = std::operator==(in_RDI,__rhs_00), !_Var1));
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool Node::hasAtom(const std::string& id) {
	if (auto* a = dynamic_cast<Array*>(this)) {
		for (auto i = a->a.size(); (i--) != 0;) {
			if (Atom* at = dynamic_cast<Atom*>(a->a[i])) {
				if (at->id == id) {
					return true;
				}
			}
		}
	} else if (Atom* a = dynamic_cast<Atom*>(this)) {
		return a->id == id;
	}
	return false;
}